

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

void connection_on_bytes_received(void *context,uchar *buffer,size_t size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  size_t i;
  size_t size_local;
  uchar *buffer_local;
  void *context_local;
  
  l = (LOGGER_LOG)0x0;
  while( true ) {
    if (size <= l) {
      return;
    }
    iVar1 = connection_byte_received((CONNECTION_HANDLE)context,buffer[(long)l]);
    if (iVar1 != 0) break;
    l = l + 1;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 == (LOGGER_LOG)0x0) {
    return;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
            ,"connection_on_bytes_received",0x2d3,1,"Cannot process received bytes");
  return;
}

Assistant:

static void connection_on_bytes_received(void* context, const unsigned char* buffer, size_t size)
{
    size_t i;

    for (i = 0; i < size; i++)
    {
        if (connection_byte_received((CONNECTION_HANDLE)context, buffer[i]) != 0)
        {
            LogError("Cannot process received bytes");
            break;
        }
    }
}